

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::ReadUSDZAssetInfoFromFile
               (string *_filename,USDZAsset *asset,string *warn,string *err,
               size_t max_memory_limit_in_mb)

{
  bool bVar1;
  uchar *addr;
  size_type length;
  size_t max_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string base_dir;
  undefined1 local_58 [8];
  string filepath;
  size_t max_memory_limit_in_mb_local;
  string *err_local;
  string *warn_local;
  USDZAsset *asset_local;
  string *_filename_local;
  
  io::ExpandFilePath((string *)local_58,(string *)_filename,(void *)0x0);
  io::GetBaseDir((string *)
                 &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(string *)_filename);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
  bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes,
                            (string *)err,(string *)local_58,max_memory_limit_in_mb << 0x14,
                            (void *)0x0);
  if (bVar1) {
    addr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
    length = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
    _filename_local._7_1_ = ReadUSDZAssetInfoFromMemory(addr,length,false,asset,warn,err);
  }
  else {
    _filename_local._7_1_ = false;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
  ::std::__cxx11::string::~string
            ((string *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::__cxx11::string::~string((string *)local_58);
  return _filename_local._7_1_;
}

Assistant:

bool ReadUSDZAssetInfoFromFile(const std::string &_filename, USDZAsset *asset,
  std::string *warn, std::string *err, size_t max_memory_limit_in_mb) {

  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);
  std::string base_dir = io::GetBaseDir(_filename);

  std::vector<uint8_t> data;
  size_t max_bytes = 1024ull * 1024ull * max_memory_limit_in_mb;
  if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                         /* userdata */ nullptr)) {
    return false;
  }

  return ReadUSDZAssetInfoFromMemory(data.data(), data.size(), /* asset_on_memory */false, asset, warn, err);

}